

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedFloatType<double>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedFloatType<double> min,WrappedFloatType<double> max,float gridSize)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  double __y;
  WrappedFloatType<double> WVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double __x;
  double dVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  deRandom rnd;
  int local_e8;
  int local_e4;
  deRandom local_40;
  
  iVar6 = componentCount * 8;
  if (stride != 0) {
    iVar6 = stride;
  }
  iVar5 = iVar6 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar5 = 0;
  }
  pcVar2 = (char *)operator_new__((long)(iVar5 * count + offset));
  deRandom_init(&local_40,seed);
  if ((primitive == PRIMITIVE_TRIANGLES) && (0 < count)) {
    fVar16 = (float)max.m_value - (float)min.m_value;
    uVar7 = -(uint)(-fVar16 <= fVar16);
    fVar15 = (float)(~uVar7 & (uint)-fVar16 | uVar7 & (uint)fVar16) * gridSize;
    fVar17 = 4.0;
    if (4.0 <= fVar15) {
      fVar17 = fVar15;
    }
    __y = (double)fVar17;
    local_e4 = 0x10;
    local_e8 = 0x18;
    uVar4 = 0;
    do {
      uVar7 = 0;
      while( true ) {
        WVar9.m_value = min.m_value;
        if (min.m_value <= max.m_value) {
          fVar15 = deRandom_getFloat(&local_40);
          WVar9.m_value = (double)(fVar15 * fVar16) + min.m_value;
        }
        dVar10 = fmod(WVar9.m_value,__y);
        dVar10 = WVar9.m_value - dVar10;
        dVar11 = __y;
        if (fVar17 <= ABS((float)(max.m_value - dVar10))) {
          fVar15 = deRandom_getFloat(&local_40);
          dVar11 = (double)((ABS((float)(max.m_value - dVar10)) - fVar17) * fVar15) + __y;
        }
        dVar12 = fmod(dVar11,__y);
        WVar9.m_value = min.m_value;
        if (min.m_value <= max.m_value) {
          fVar15 = deRandom_getFloat(&local_40);
          WVar9.m_value = (double)(fVar15 * fVar16) + min.m_value;
        }
        dVar13 = fmod(WVar9.m_value,__y);
        dVar13 = WVar9.m_value - dVar13;
        __x = __y;
        if (fVar17 <= ABS((float)(max.m_value - dVar13))) {
          fVar15 = deRandom_getFloat(&local_40);
          __x = (double)((ABS((float)(max.m_value - dVar13)) - fVar17) * fVar15) + __y;
        }
        dVar14 = fmod(__x,__y);
        dVar18 = 0.0;
        if (2 < componentCount) {
          WVar9.m_value = min.m_value;
          if (min.m_value <= max.m_value) {
            fVar15 = deRandom_getFloat(&local_40);
            WVar9.m_value = (double)(fVar15 * fVar16) + min.m_value;
          }
          dVar18 = fmod(WVar9.m_value,__y);
          dVar18 = WVar9.m_value - dVar18;
        }
        dVar19 = 1.0;
        if (3 < componentCount) {
          WVar9.m_value = min.m_value;
          if (min.m_value <= max.m_value) {
            fVar15 = deRandom_getFloat(&local_40);
            WVar9.m_value = (double)(fVar15 * fVar16) + min.m_value;
          }
          dVar19 = fmod(WVar9.m_value,__y);
          dVar19 = WVar9.m_value - dVar19;
        }
        if ((componentCount < 3) ||
           (((fVar15 = (float)dVar18 + (float)(dVar11 - dVar12), uVar8 = -(uint)(-fVar15 <= fVar15),
             fVar17 <= (float)(~uVar8 & (uint)-fVar15 | (uint)fVar15 & uVar8) &&
             (fVar15 = (float)dVar19 + (float)(__x - dVar14), uVar8 = -(uint)(-fVar15 <= fVar15),
             fVar17 <= (float)(~uVar8 & (uint)-fVar15 | (uint)fVar15 & uVar8))) || (2 < uVar7))))
        break;
        uVar7 = uVar7 + 1;
      }
      iVar1 = iVar5 * (int)uVar4;
      *(double *)(pcVar2 + (long)iVar1 + (long)offset) = dVar10;
      *(double *)(pcVar2 + (long)(iVar1 + 8) + (long)offset) = dVar13;
      dVar11 = (dVar11 - dVar12) + dVar10;
      *(double *)(pcVar2 + (long)(iVar1 + iVar6) + (long)offset) = dVar11;
      *(double *)(pcVar2 + (long)(iVar1 + 8 + iVar6) + (long)offset) = dVar13;
      *(double *)(pcVar2 + (long)(iVar1 + iVar6 * 2) + (long)offset) = dVar10;
      dVar12 = (__x - dVar14) + dVar13;
      *(double *)(pcVar2 + (long)(iVar1 + 8 + iVar6 * 2) + (long)offset) = dVar12;
      *(double *)(pcVar2 + (long)(iVar1 + iVar6 * 3) + (long)offset) = dVar10;
      *(double *)(pcVar2 + (long)(iVar1 + 8 + iVar6 * 3) + (long)offset) = dVar12;
      *(double *)(pcVar2 + (long)(iVar1 + iVar6 * 4) + (long)offset) = dVar11;
      *(double *)(pcVar2 + (long)(iVar1 + 8 + iVar6 * 4) + (long)offset) = dVar13;
      *(double *)(pcVar2 + (long)(iVar1 + iVar6 * 5) + (long)offset) = dVar11;
      *(double *)(pcVar2 + (long)(iVar1 + iVar6 * 5 + 8) + (long)offset) = dVar12;
      if (2 < componentCount) {
        lVar3 = 6;
        iVar1 = local_e4;
        do {
          *(double *)(pcVar2 + (long)iVar1 + (long)offset) = dVar18;
          iVar1 = iVar1 + iVar6;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
      if (3 < componentCount) {
        lVar3 = 6;
        iVar1 = local_e8;
        do {
          *(double *)(pcVar2 + (long)iVar1 + (long)offset) = dVar19;
          iVar1 = iVar1 + iVar6;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
      uVar4 = uVar4 + 1;
      local_e4 = local_e4 + iVar5;
      local_e8 = local_e8 + iVar5;
    } while (uVar4 != (uint)count);
  }
  return pcVar2;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}